

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

void __thiscall fasttext::FastText::getSentenceVector(FastText *this,istream *in,Vector *svec)

{
  element_type *peVar1;
  char cVar2;
  istream *piVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  real rVar7;
  vector<int,_std::allocator<int>_> labels;
  string word;
  Vector vec;
  vector<int,_std::allocator<int>_> line;
  vector<int,_std::allocator<int>_> local_218;
  string local_1f0;
  Vector local_1d0;
  vector<int,_std::allocator<int>_> local_1b8 [5];
  ios_base local_140 [272];
  
  Vector::zero(svec);
  peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->model == sup) {
    local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,local_1b8,&local_218);
    if (local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      uVar6 = 0;
      do {
        addInputVector(this,svec,
                       local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6]);
        uVar6 = uVar6 + 1;
        uVar4 = (long)local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2;
      } while (uVar6 < uVar4);
      if (local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start !=
          local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish) {
        Vector::mul(svec,(float)(1.0 / (double)(long)uVar4));
      }
    }
    local_1d0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((pointer *)
        local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      local_1d0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_1b8[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
  }
  else {
    Vector::Vector(&local_1d0,(long)peVar1->dim);
    local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)&local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((ulong)local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)in + -0x18) + (char)in);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&local_218,cVar2);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b8,(string *)&local_218,_S_in);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    iVar5 = 0;
    while (piVar3 = std::operator>>((istream *)local_1b8,(string *)&local_1f0),
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      getWordVector(this,&local_1d0,&local_1f0);
      rVar7 = Vector::norm(&local_1d0);
      if (0.0 < rVar7) {
        Vector::mul(&local_1d0,1.0 / rVar7);
        Vector::addVector(svec,&local_1d0);
        iVar5 = iVar5 + 1;
      }
    }
    if (iVar5 != 0) {
      Vector::mul(svec,1.0 / (float)iVar5);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8);
    std::ios_base::~ios_base(local_140);
    if ((pointer *)
        local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        &local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
      operator_delete(local_218.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_1d0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FastText::getSentenceVector(
    std::istream& in,
    fasttext::Vector& svec) {
  svec.zero();
  if (args_->model == model_name::sup) {
    std::vector<int32_t> line, labels;
    dict_->getLine(in, line, labels);
    for (int32_t i = 0; i < line.size(); i++) {
      addInputVector(svec, line[i]);
    }
    if (!line.empty()) {
      svec.mul(1.0 / line.size());
    }
  } else {
    Vector vec(args_->dim);
    std::string sentence;
    std::getline(in, sentence);
    std::istringstream iss(sentence);
    std::string word;
    int32_t count = 0;
    while (iss >> word) {
      getWordVector(vec, word);
      real norm = vec.norm();
      if (norm > 0) {
        vec.mul(1.0 / norm);
        svec.addVector(vec);
        count++;
      }
    }
    if (count > 0) {
      svec.mul(1.0 / count);
    }
  }
}